

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O0

void __thiscall YAML::Stream::StreamInUtf16(Stream *this)

{
  ushort uVar1;
  uchar uVar2;
  uchar uVar3;
  uint uVar4;
  ulong uVar5;
  long in_RDI;
  unsigned_long chLow;
  int nBigEnd;
  uchar bytes [2];
  unsigned_long ch;
  unsigned_long in_stack_00000038;
  deque<char,_std::allocator<char>_> *in_stack_00000040;
  undefined2 in_stack_ffffffffffffffec;
  undefined1 in_stack_ffffffffffffffee;
  undefined1 in_stack_ffffffffffffffef;
  
  uVar4 = (uint)(*(int *)(in_RDI + 0x14) != 2);
  uVar2 = GetNextByte((Stream *)
                      CONCAT17(in_stack_ffffffffffffffef,
                               CONCAT16(in_stack_ffffffffffffffee,
                                        CONCAT24(in_stack_ffffffffffffffec,uVar4))));
  uVar3 = GetNextByte((Stream *)
                      CONCAT17(in_stack_ffffffffffffffef,
                               CONCAT16(uVar2,CONCAT24(in_stack_ffffffffffffffec,uVar4))));
  uVar5 = std::ios::good();
  if ((uVar5 & 1) != 0) {
    uVar1 = CONCAT11((&stack0xffffffffffffffee)[(int)uVar4],
                     (&stack0xffffffffffffffee)[(int)(uVar4 ^ 1)]);
    if ((uVar1 < 0xdc00) || (0xdfff < uVar1)) {
      if ((uVar1 < 0xd800) || (0xdbff < uVar1)) {
LAB_00f2ac3a:
        QueueUnicodeCodepoint(in_stack_00000040,in_stack_00000038);
      }
      else {
        do {
          uVar2 = GetNextByte((Stream *)
                              CONCAT17(uVar3,CONCAT16(uVar2,CONCAT24(in_stack_ffffffffffffffec,uVar4
                                                                    ))));
          uVar3 = GetNextByte((Stream *)
                              CONCAT17(uVar3,CONCAT16(uVar2,CONCAT24(in_stack_ffffffffffffffec,uVar4
                                                                    ))));
          uVar5 = std::ios::good();
          if ((uVar5 & 1) == 0) {
            QueueUnicodeCodepoint(in_stack_00000040,in_stack_00000038);
            return;
          }
          uVar1 = CONCAT11((&stack0xffffffffffffffee)[(int)uVar4],
                           (&stack0xffffffffffffffee)[(int)(uVar4 ^ 1)]);
          if ((0xdbff < uVar1) && (uVar1 < 0xe000)) goto LAB_00f2ac3a;
          QueueUnicodeCodepoint(in_stack_00000040,in_stack_00000038);
        } while ((0xd7ff < uVar1) && (uVar1 < 0xe000));
        QueueUnicodeCodepoint(in_stack_00000040,in_stack_00000038);
      }
    }
    else {
      QueueUnicodeCodepoint(in_stack_00000040,in_stack_00000038);
    }
  }
  return;
}

Assistant:

void Stream::StreamInUtf16() const {
  unsigned long ch = 0;
  unsigned char bytes[2];
  int nBigEnd = (m_charSet == utf16be) ? 0 : 1;

  bytes[0] = GetNextByte();
  bytes[1] = GetNextByte();
  if (!m_input.good()) {
    return;
  }
  ch = (static_cast<unsigned long>(bytes[nBigEnd]) << 8) |
       static_cast<unsigned long>(bytes[1 ^ nBigEnd]);

  if (ch >= 0xDC00 && ch < 0xE000) {
    // Trailing (low) surrogate...ugh, wrong order
    QueueUnicodeCodepoint(m_readahead, CP_REPLACEMENT_CHARACTER);
    return;
  }

  if (ch >= 0xD800 && ch < 0xDC00) {
    // ch is a leading (high) surrogate

    // Four byte UTF-8 code point

    // Read the trailing (low) surrogate
    for (;;) {
      bytes[0] = GetNextByte();
      bytes[1] = GetNextByte();
      if (!m_input.good()) {
        QueueUnicodeCodepoint(m_readahead, CP_REPLACEMENT_CHARACTER);
        return;
      }
      unsigned long chLow = (static_cast<unsigned long>(bytes[nBigEnd]) << 8) |
                            static_cast<unsigned long>(bytes[1 ^ nBigEnd]);
      if (chLow < 0xDC00 || chLow >= 0xE000) {
        // Trouble...not a low surrogate.  Dump a REPLACEMENT CHARACTER into the
        // stream.
        QueueUnicodeCodepoint(m_readahead, CP_REPLACEMENT_CHARACTER);

        // Deal with the next UTF-16 unit
        if (chLow < 0xD800 || chLow >= 0xE000) {
          // Easiest case: queue the codepoint and return
          QueueUnicodeCodepoint(m_readahead, ch);
          return;
        }
        // Start the loop over with the new high surrogate
        ch = chLow;
        continue;
      }

      // Select the payload bits from the high surrogate
      ch &= 0x3FF;
      ch <<= 10;

      // Include bits from low surrogate
      ch |= (chLow & 0x3FF);

      // Add the surrogacy offset
      ch += 0x10000;
      break;
    }
  }

  QueueUnicodeCodepoint(m_readahead, ch);
}